

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V2_annotation.cpp
# Opt level: O2

bool __thiscall ON_OBSOLETE_V5_DimAngular::GetArc(ON_OBSOLETE_V5_DimAngular *this,ON_Arc *arc)

{
  ON_3dVector *this_00;
  ON_2dPoint *pOVar1;
  double dVar2;
  bool bVar3;
  long lVar4;
  ON_Plane *this_01;
  ON_Arc *pOVar5;
  byte bVar6;
  ON_3dVector X;
  ON_3dVector Y;
  ON_Interval local_40;
  
  bVar6 = 0;
  bVar3 = ON_IsValid(this->m_radius);
  if (!bVar3) {
    return false;
  }
  if (this->m_radius <= 1.490116119385e-08) {
    return false;
  }
  bVar3 = ON_IsValid(this->m_angle);
  if (bVar3) {
    if (this->m_angle <= 0.0) {
      return false;
    }
    if (6.283185307179586 < this->m_angle) {
      return false;
    }
    this_01 = &(this->super_ON_OBSOLETE_V5_Annotation).m_plane;
    bVar3 = ON_3dPoint::IsValid(&this_01->origin);
    if (((bVar3) &&
        (bVar3 = ON_3dVector::IsValid(&(this->super_ON_OBSOLETE_V5_Annotation).m_plane.xaxis), bVar3
        )) && (bVar3 = ON_3dVector::IsValid(&(this->super_ON_OBSOLETE_V5_Annotation).m_plane.yaxis),
              bVar3)) {
      this_00 = &(this->super_ON_OBSOLETE_V5_Annotation).m_plane.zaxis;
      bVar3 = ON_3dVector::IsValid(this_00);
      if (bVar3) {
        dVar2 = ON_3dVector::Length(this_00);
        if (1.490116119385e-08 < ABS(dVar2 + -1.0)) {
          return false;
        }
        if ((this->super_ON_OBSOLETE_V5_Annotation).m_points.super_ON_SimpleArray<ON_2dPoint>.
            m_count != 4) {
          return false;
        }
        pOVar1 = (this->super_ON_OBSOLETE_V5_Annotation).m_points.super_ON_SimpleArray<ON_2dPoint>.
                 m_a;
        ON_Plane::PointAt((ON_3dPoint *)&Y,this_01,pOVar1[1].x,pOVar1[1].y);
        ON_3dPoint::operator-(&X,(ON_3dPoint *)&Y,&this_01->origin);
        dVar2 = ON_3dVector::Length(&X);
        if (((ABS(dVar2 + -1.0) <= 1.490116119385e-08) || (bVar3 = ON_3dVector::Unitize(&X), bVar3))
           && (dVar2 = ON_3dVector::operator*(&X,this_00), ABS(dVar2) <= 1.490116119385e-08)) {
          ON_CrossProduct(&Y,this_00,&X);
          dVar2 = ON_3dVector::Length(&Y);
          if ((ABS(dVar2 + -1.0) <= 1.490116119385e-08) || (bVar3 = ON_3dVector::Unitize(&Y), bVar3)
             ) {
            pOVar5 = arc;
            for (lVar4 = 0x10; lVar4 != 0; lVar4 = lVar4 + -1) {
              (pOVar5->super_ON_Circle).plane.origin.x = (this_01->origin).x;
              this_01 = (ON_Plane *)((long)this_01 + (ulong)bVar6 * -0x10 + 8);
              pOVar5 = (ON_Arc *)((long)pOVar5 + (ulong)bVar6 * -0x10 + 8);
            }
            (arc->super_ON_Circle).plane.xaxis.z = X.z;
            (arc->super_ON_Circle).plane.xaxis.x = X.x;
            (arc->super_ON_Circle).plane.xaxis.y = X.y;
            (arc->super_ON_Circle).plane.yaxis.x = Y.x;
            (arc->super_ON_Circle).plane.yaxis.y = Y.y;
            (arc->super_ON_Circle).plane.yaxis.z = Y.z;
            ON_Plane::UpdateEquation((ON_Plane *)arc);
            ON_Interval::ON_Interval(&local_40,0.0,this->m_angle);
            ON_Arc::SetAngleIntervalRadians(arc,local_40);
            (arc->super_ON_Circle).radius = this->m_radius;
            return true;
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool ON_OBSOLETE_V5_DimAngular::GetArc( ON_Arc& arc ) const
{
  bool rc = false;
  // Jan 25, 2007 - changed min radius from >0 to >ON_SQRT_EPSILON
  // to avoid domain problems trying to use very small arcs later
  if ( ON_IsValid(m_radius) && m_radius > ON_SQRT_EPSILON
      && ON_IsValid(m_angle) && m_angle > 0.0 && m_angle <= 2.0*ON_PI
      && m_plane.origin.IsValid() 
      && m_plane.xaxis.IsValid() 
      && m_plane.yaxis.IsValid() 
      && m_plane.zaxis.IsValid()
      && fabs( m_plane.zaxis.Length() - 1.0 ) <= ON_SQRT_EPSILON
      && 4 == m_points.Count()
      )
  {
    ON_3dVector X = m_plane.PointAt( m_points[start_pt_index].x, m_points[start_pt_index].y ) - m_plane.origin;
    if ( fabs(X.Length()-1.0) <= ON_SQRT_EPSILON || X.Unitize() )
    {
      if ( fabs(X*m_plane.zaxis) <= ON_SQRT_EPSILON )
      {
        ON_3dVector Y = ON_CrossProduct( m_plane.zaxis, X );
        if ( fabs(Y.Length()-1.0) <= ON_SQRT_EPSILON || Y.Unitize() )
        {
          arc.plane = m_plane;
          arc.plane.xaxis = X;
          arc.plane.yaxis = Y;
          arc.plane.UpdateEquation();
          arc.SetAngleIntervalRadians( ON_Interval(0.0,m_angle) );
          arc.radius = m_radius;
          rc = true;
        }
      }
    }
  }

  return rc;
}